

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::Option::~Option(Option *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->proc_results_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->results_);
  p_Var1 = (this->callback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->callback_,(_Any_data *)&this->callback_,__destroy_functor);
  }
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&(this->excludes_)._M_t);
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&(this->needs_)._M_t);
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::~vector(&this->validators_);
  p_Var1 = (this->default_function_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->default_function_,(_Any_data *)&this->default_function_,
              __destroy_functor);
  }
  p_Var1 = (this->type_name_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->type_name_,(_Any_data *)&this->type_name_,__destroy_functor);
  }
  pcVar2 = (this->option_text_)._M_dataplus._M_p;
  paVar3 = &(this->option_text_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->default_str_)._M_dataplus._M_p;
  paVar3 = &(this->default_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->description_)._M_dataplus._M_p;
  paVar3 = &(this->description_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->envname_)._M_dataplus._M_p;
  paVar3 = &(this->envname_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->pname_)._M_dataplus._M_p;
  paVar3 = &(this->pname_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->fnames_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->default_flag_values_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->lnames_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->snames_);
  pcVar2 = (this->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
  paVar3 = &(this->super_OptionBase<CLI::Option>).group_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

class Option : public OptionBase<Option> {
    friend App;

  protected:
    /// @name Names
    ///@{

    /// A list of the short names (`-a`) without the leading dashes
    std::vector<std::string> snames_{};

    /// A list of the long names (`--long`) without the leading dashes
    std::vector<std::string> lnames_{};

    /// A list of the flag names with the appropriate default value, the first part of the pair should be duplicates of
    /// what is in snames or lnames but will trigger a particular response on a flag
    std::vector<std::pair<std::string, std::string>> default_flag_values_{};

    /// a list of flag names with specified default values;
    std::vector<std::string> fnames_{};

    /// A positional name
    std::string pname_{};

    /// If given, check the environment for this option
    std::string envname_{};

    ///@}
    /// @name Help
    ///@{

    /// The description for help strings
    std::string description_{};

    /// A human readable default value, either manually set, captured, or captured by default
    std::string default_str_{};

    /// If given, replace the text that describes the option type and usage in the help text
    std::string option_text_{};

    /// A human readable type value, set when App creates this
    ///
    /// This is a lambda function so "types" can be dynamic, such as when a set prints its contents.
    std::function<std::string()> type_name_{[]() { return std::string(); }};

    /// Run this function to capture a default (ignore if empty)
    std::function<std::string()> default_function_{};

    ///@}
    /// @name Configuration
    ///@{

    /// The number of arguments that make up one option. max is the nominal type size, min is the minimum number of
    /// strings
    int type_size_max_{1};
    /// The minimum number of arguments an option should be expecting
    int type_size_min_{1};

    /// The minimum number of expected values
    int expected_min_{1};
    /// The maximum number of expected values
    int expected_max_{1};

    /// A list of Validators to run on each value parsed
    std::vector<Validator> validators_{};

    /// A list of options that are required with this option
    std::set<Option *> needs_{};

    /// A list of options that are excluded with this option
    std::set<Option *> excludes_{};

    ///@}
    /// @name Other
    ///@{

    /// link back up to the parent App for fallthrough
    App *parent_{nullptr};

    /// Options store a callback to do all the work
    callback_t callback_{};

    ///@}
    /// @name Parsing results
    ///@{

    /// complete Results of parsing
    results_t results_{};
    /// results after reduction
    results_t proc_results_{};
    /// enumeration for the option state machine
    enum class option_state : char {
        parsing = 0,       //!< The option is currently collecting parsed results
        validated = 2,     //!< the results have been validated
        reduced = 4,       //!< a subset of results has been generated
        callback_run = 6,  //!< the callback has been executed
    };
    /// Whether the callback has run (needed for INI parsing)
    option_state current_option_state_{option_state::parsing};
    /// Specify that extra args beyond type_size_max should be allowed
    bool allow_extra_args_{false};
    /// Specify that the option should act like a flag vs regular option
    bool flag_like_{false};
    /// Control option to run the callback to set the default
    bool run_callback_for_default_{false};
    /// flag indicating a separator needs to be injected after each argument call
    bool inject_separator_{false};
    /// flag indicating that the option should trigger the validation and callback chain on each result when loaded
    bool trigger_on_result_{false};
    /// flag indicating that the option should force the callback regardless if any results present
    bool force_callback_{false};
    ///@}

    /// Making an option by hand is not defined, it must be made by the App class
    Option(std::string option_name, std::string option_description, callback_t callback, App *parent)
        : description_(std::move(option_description)), parent_(parent), callback_(std::move(callback)) {
        std::tie(snames_, lnames_, pname_) = detail::get_names(detail::split_names(option_name));
    }

  public:
    /// @name Basic
    ///@{

    Option(const Option &) = delete;
    Option &operator=(const Option &) = delete;

    /// Count the total number of times an option was passed
    CLI11_NODISCARD std::size_t count() const { return results_.size(); }

    /// True if the option was not passed
    CLI11_NODISCARD bool empty() const { return results_.empty(); }